

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tls-network.c
# Opt level: O3

int lws_tls_cert_updated
              (lws_context *context,char *certpath,char *keypath,char *mem_cert,size_t len_mem_cert,
              char *mem_privkey,size_t len_mem_privkey)

{
  lws_vhost *vhost;
  char *__s1;
  char *__s1_00;
  int iVar1;
  lws wsi;
  
  wsi.context = context;
  for (vhost = context->vhost_list; vhost != (lws_vhost *)0x0; vhost = vhost->vhost_next) {
    __s1 = (vhost->tls).alloc_cert_path;
    if ((((__s1 != (char *)0x0) && (__s1_00 = (vhost->tls).key_path, __s1_00 != (char *)0x0)) &&
        (wsi.vhost = vhost, iVar1 = strcmp(__s1,certpath), iVar1 == 0)) &&
       ((iVar1 = strcmp(__s1_00,keypath), iVar1 == 0 &&
        (lws_tls_server_certs_load
                   (vhost,&wsi,certpath,keypath,mem_cert,len_mem_cert,mem_privkey,len_mem_privkey),
        ((vhost->tls).field_0x64 & 2) != 0)))) {
      _lws_log(4,"%s: vhost %s: cert unset\n","lws_tls_cert_updated",vhost->name);
    }
  }
  return 0;
}

Assistant:

int
lws_tls_cert_updated(struct lws_context *context, const char *certpath,
		     const char *keypath,
		     const char *mem_cert, size_t len_mem_cert,
		     const char *mem_privkey, size_t len_mem_privkey)
{
	struct lws wsi;

	wsi.context = context;

	lws_start_foreach_ll(struct lws_vhost *, v, context->vhost_list) {
		wsi.vhost = v; /* not a real bound wsi */
		if (v->tls.alloc_cert_path && v->tls.key_path &&
		    !strcmp(v->tls.alloc_cert_path, certpath) &&
		    !strcmp(v->tls.key_path, keypath)) {
			lws_tls_server_certs_load(v, &wsi, certpath, keypath,
						  mem_cert, len_mem_cert,
						  mem_privkey, len_mem_privkey);

			if (v->tls.skipped_certs)
				lwsl_notice("%s: vhost %s: cert unset\n",
					    __func__, v->name);
		}
	} lws_end_foreach_ll(v, vhost_next);

	return 0;
}